

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh4asm_txt_emit.h
# Opt level: O0

char * sh4asm_imm8_str(uint imm8,uint shift)

{
  uint shift_local;
  uint imm8_local;
  
  snprintf(sh4asm_imm8_str::buf,8,"0x%x",
           (ulong)(imm8 & (0x100 << ((byte)shift & 0x1f)) - 1U &
                  ((1 << ((byte)shift & 0x1f)) - 1U ^ 0xffffffff)));
  sh4asm_imm8_str::buf[7] = '\0';
  return sh4asm_imm8_str::buf;
}

Assistant:

static char const *sh4asm_imm8_str(unsigned imm8, unsigned shift) {
    // TODO: pad output to two digits
    static char buf[8];
    snprintf(buf, sizeof(buf), "0x%x", //"0x%02x",
             imm8 & ((256 << shift) - 1) & ~((1 << shift) - 1));
    buf[7] = '\0';
    return buf;
}